

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

type * Disa::operator+(type *__return_storage_ptr__,Vector_Dense<double,_3UL> *vector0,
                      Vector_Dense<double,_2UL> *vector1)

{
  source_location *psVar1;
  source_location *location;
  ostream *poVar2;
  size_type sVar3;
  anon_class_16_2_91b2bd8a local_140;
  function<double_(unsigned_long)> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  array<double,_2UL> *local_18;
  Vector_Dense<double,_2UL> *vector1_local;
  Vector_Dense<double,_3UL> *vector0_local;
  
  local_18 = &vector1->super_array<double,_2UL>;
  vector1_local = (Vector_Dense<double,_2UL> *)vector0;
  psVar1 = (source_location *)std::array<double,_3UL>::size(&vector0->super_array<double,_3UL>);
  location = (source_location *)std::array<double,_2UL>::size(local_18);
  if (psVar1 != location) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001b64b0;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    sVar3 = std::array<double,_3UL>::size((array<double,_3UL> *)vector1_local);
    std::__cxx11::to_string(&local_f0,sVar3);
    std::operator+(&local_d0,"Incompatible vector sizes, ",&local_f0);
    std::operator+(&local_b0,&local_d0," vs. ");
    sVar3 = std::array<double,_2UL>::size(local_18);
    std::__cxx11::to_string(&local_110,sVar3);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  local_140.vector0 = (Vector_Dense<double,_3UL> *)vector1_local;
  local_140.vector1 = (Vector_Dense<double,_2UL> *)local_18;
  std::function<double(unsigned_long)>::operator+
            ((function<double(unsigned_long)> *)&local_130,&local_140);
  sVar3 = std::array<double,_3UL>::size((array<double,_3UL> *)vector1_local);
  Vector_Dense<double,_3UL>::Vector_Dense(__return_storage_ptr__,&local_130,sVar3);
  std::function<double_(unsigned_long)>::~function(&local_130);
  return __return_storage_ptr__;
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type constexpr operator+(
const Vector_Dense<_type, _size_0>& vector0, const Vector_Dense<_type, _size_1>& vector1) {
  ASSERT_DEBUG(vector0.size() == vector1.size(), "Incompatible vector sizes, " + std::to_string(vector0.size()) +
                                                 " vs. " + std::to_string(vector1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  return _return_vector([&](const std::size_t ii) { return vector0[ii] + vector1[ii]; }, vector0.size());
}